

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.h
# Opt level: O0

void __thiscall GdlPass::GdlPass(GdlPass *this,int nNum,int nMaxRuleLoop,int nMaxBackup)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  GdlObject *in_stack_00000040;
  undefined8 local_20;
  
  GdlObject::GdlObject(in_stack_00000040);
  *(undefined4 *)(in_RDI + 0x28) = in_ESI;
  *(undefined4 *)(in_RDI + 0x2c) = in_EDX;
  *(undefined4 *)(in_RDI + 0x30) = in_ECX;
  std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::vector
            ((vector<GdlRule_*,_std::allocator<GdlRule_*>_> *)0x1a9687);
  std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::vector
            ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)0x1a9695);
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined1 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined1 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x90) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  std::
  map<unsigned_short,_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
  ::map((map<unsigned_short,_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
         *)0x1a96e2);
  std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::vector
            ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)0x1a96f3);
  local_20 = in_RDI + 0x100;
  do {
    std::
    set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>::
    set((set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
         *)0x1a9720);
    local_20 = local_20 + 0x30;
  } while (local_20 != in_RDI + 0x3000d0);
  std::
  map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
  ::map((map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
         *)0x1a9748);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a9759);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a976a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a977b);
  return;
}

Assistant:

GdlPass(int nNum, int nMaxRuleLoop, int nMaxBackup)
		:	m_nNumber(nNum),
			m_nMaxRuleLoop(nMaxRuleLoop),
			m_nMaxBackup(nMaxBackup),
			m_nCollisionFix(0),
			m_nAutoKern(false),
			m_nCollisionThreshold(0),
			m_nDir(0),
			m_fFlipDir(0),
			m_nGlobalID(-1),
			m_nPreBidiPass(0),
			m_pfsm(NULL)
	{
	}